

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseResolveOrRejectFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseResolveOrRejectFunctionInfo *pSVar1;
  SnapPromiseResolveOrRejectFunctionInfo *pSVar2;
  SnapPromiseResolveOrRejectFunctionInfo *rrfInfo2;
  SnapPromiseResolveOrRejectFunctionInfo *rrfInfo1;
  TTDCompareMap *compareMap_local;
  SnapObject *sobj2_local;
  SnapObject *sobj1_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseResolveOrRejectFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)29>
                     (sobj1);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseResolveOrRejectFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)29>
                     (sobj2);
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,pSVar1->PromiseId,pSVar2->PromiseId,L"promise");
  TTDCompareMap::DiagnosticAssert(compareMap,(pSVar1->IsReject & 1U) == (pSVar2->IsReject & 1U));
  TTDCompareMap::DiagnosticAssert
            (compareMap,(pSVar1->AlreadyResolvedValue & 1U) == (pSVar2->AlreadyResolvedValue & 1U));
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,pSVar1->AlreadyResolvedWrapperId,pSVar2->AlreadyResolvedWrapperId);
  return;
}

Assistant:

void AssertSnapEquiv_SnapPromiseResolveOrRejectFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(sobj1);
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(sobj2);

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(rrfInfo1->PromiseId, rrfInfo2->PromiseId, _u("promise"));

            compareMap.DiagnosticAssert(rrfInfo1->IsReject == rrfInfo2->IsReject);
            compareMap.DiagnosticAssert(rrfInfo1->AlreadyResolvedValue == rrfInfo2->AlreadyResolvedValue);

            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(rrfInfo1->AlreadyResolvedWrapperId, rrfInfo2->AlreadyResolvedWrapperId);
        }